

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O3

void __thiscall testing::internal::FilePath::Normalize(FilePath *this)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  
  pcVar1 = (this->pathname_)._M_dataplus._M_p;
  pcVar2 = pcVar1;
  pcVar3 = pcVar1;
  if ((this->pathname_)._M_string_length != 0) {
    do {
      cVar4 = *pcVar2;
      if (((cVar4 != '/') || (cVar4 = '/', pcVar1 == pcVar3)) || (pcVar1[-1] != '/')) {
        *pcVar1 = cVar4;
        pcVar1 = pcVar1 + 1;
      }
      pcVar2 = pcVar2 + 1;
      pcVar3 = (this->pathname_)._M_dataplus._M_p;
    } while (pcVar2 != pcVar3 + (this->pathname_)._M_string_length);
  }
  (this->pathname_)._M_string_length = (long)pcVar1 - (long)pcVar3;
  *pcVar1 = '\0';
  return;
}

Assistant:

void FilePath::Normalize() {
  auto out = pathname_.begin();

  auto i = pathname_.cbegin();
#ifdef GTEST_OS_WINDOWS
  // UNC paths are treated specially
  if (pathname_.end() - i >= 3 && IsPathSeparator(*i) &&
      IsPathSeparator(*(i + 1)) && !IsPathSeparator(*(i + 2))) {
    *(out++) = kPathSeparator;
    *(out++) = kPathSeparator;
  }
#endif
  while (i != pathname_.end()) {
    const char character = *i;
    if (!IsPathSeparator(character)) {
      *(out++) = character;
    } else if (out == pathname_.begin() || *std::prev(out) != kPathSeparator) {
      *(out++) = kPathSeparator;
    }
    ++i;
  }

  pathname_.erase(out, pathname_.end());
}